

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O2

void tss_load_seg(CPUX86State *env,int seg_reg,int selector,int cpl,uintptr_t retaddr)

{
  int iVar1;
  undefined8 in_RAX;
  uint uVar2;
  uint uVar3;
  uint32_t e2;
  uint32_t e1;
  
  uVar3 = selector & 0xfffc;
  if (uVar3 == 0) {
    if (1 < seg_reg - 1U) {
      return;
    }
    iVar1 = 10;
    uVar3 = 0;
    goto LAB_004da7c3;
  }
  _e2 = in_RAX;
  iVar1 = load_segment_ra(env,&e1,&e2,selector,retaddr);
  if ((iVar1 == 0) && ((e2 >> 0xc & 1) != 0)) {
    uVar2 = e2 >> 0xd & 3;
    if (seg_reg == 2) {
      if (((e2 & 0xa00) == 0x200) && (uVar2 == cpl)) {
LAB_004da727:
        if (uVar2 == (selector & 3U)) {
LAB_004da756:
          if ((short)_e2 < 0) {
            uVar2 = e2 & 0xf0000 | e1 & 0xffff;
            uVar3 = uVar2 << 0xc | 0xfff;
            if ((e2 >> 0x17 & 1) == 0) {
              uVar3 = uVar2;
            }
            cpu_x86_load_seg_cache
                      (env,seg_reg,selector,
                       (ulong)(e2 & 0xff000000 | (e2 & 0xff) << 0x10 | e1 >> 0x10),uVar3,e2);
            return;
          }
          iVar1 = 0xb;
          goto LAB_004da7c3;
        }
      }
    }
    else if (seg_reg == 1) {
      if ((e2 >> 0xb & 1) != 0) goto LAB_004da727;
    }
    else if (((e2 & 0xa00) != 0x800) &&
            (((~e2 & 0xc00) == 0 || ((cpl <= (int)uVar2 && ((selector & 3U) <= uVar2))))))
    goto LAB_004da756;
  }
  iVar1 = 10;
LAB_004da7c3:
  raise_exception_err_ra_x86_64(env,iVar1,uVar3,retaddr);
}

Assistant:

static void tss_load_seg(CPUX86State *env, int seg_reg, int selector, int cpl,
                         uintptr_t retaddr)
{
    uint32_t e1, e2;
    int rpl, dpl;

    if ((selector & 0xfffc) != 0) {
        if (load_segment_ra(env, &e1, &e2, selector, retaddr) != 0) {
            raise_exception_err_ra(env, EXCP0A_TSS, selector & 0xfffc, retaddr);
        }
        if (!(e2 & DESC_S_MASK)) {
            raise_exception_err_ra(env, EXCP0A_TSS, selector & 0xfffc, retaddr);
        }
        rpl = selector & 3;
        dpl = (e2 >> DESC_DPL_SHIFT) & 3;
        if (seg_reg == R_CS) {
            if (!(e2 & DESC_CS_MASK)) {
                raise_exception_err_ra(env, EXCP0A_TSS, selector & 0xfffc, retaddr);
            }
            if (dpl != rpl) {
                raise_exception_err_ra(env, EXCP0A_TSS, selector & 0xfffc, retaddr);
            }
        } else if (seg_reg == R_SS) {
            /* SS must be writable data */
            if ((e2 & DESC_CS_MASK) || !(e2 & DESC_W_MASK)) {
                raise_exception_err_ra(env, EXCP0A_TSS, selector & 0xfffc, retaddr);
            }
            if (dpl != cpl || dpl != rpl) {
                raise_exception_err_ra(env, EXCP0A_TSS, selector & 0xfffc, retaddr);
            }
        } else {
            /* not readable code */
            if ((e2 & DESC_CS_MASK) && !(e2 & DESC_R_MASK)) {
                raise_exception_err_ra(env, EXCP0A_TSS, selector & 0xfffc, retaddr);
            }
            /* if data or non conforming code, checks the rights */
            if (((e2 >> DESC_TYPE_SHIFT) & 0xf) < 12) {
                if (dpl < cpl || dpl < rpl) {
                    raise_exception_err_ra(env, EXCP0A_TSS, selector & 0xfffc, retaddr);
                }
            }
        }
        if (!(e2 & DESC_P_MASK)) {
            raise_exception_err_ra(env, EXCP0B_NOSEG, selector & 0xfffc, retaddr);
        }
        cpu_x86_load_seg_cache(env, seg_reg, selector,
                               get_seg_base(e1, e2),
                               get_seg_limit(e1, e2),
                               e2);
    } else {
        if (seg_reg == R_SS || seg_reg == R_CS) {
            raise_exception_err_ra(env, EXCP0A_TSS, selector & 0xfffc, retaddr);
        }
    }
}